

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprSize(Expr *p)

{
  int iVar1;
  int local_14;
  int nByte;
  Expr *p_local;
  
  local_14 = dupedExprNodeSize(p,1);
  if (p->pLeft != (Expr *)0x0) {
    iVar1 = dupedExprSize(p->pLeft);
    local_14 = iVar1 + local_14;
  }
  if (p->pRight != (Expr *)0x0) {
    iVar1 = dupedExprSize(p->pRight);
    local_14 = iVar1 + local_14;
  }
  return local_14;
}

Assistant:

static int dupedExprSize(const Expr *p){
  int nByte;
  assert( p!=0 );
  nByte = dupedExprNodeSize(p, EXPRDUP_REDUCE);
  if( p->pLeft ) nByte += dupedExprSize(p->pLeft);
  if( p->pRight ) nByte += dupedExprSize(p->pRight);
  assert( nByte==ROUND8(nByte) );
  return nByte;
}